

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ethercatfoe.c
# Opt level: O1

int ecx_FOEread(ecx_contextt *context,uint16 slave,char *filename,uint32 password,int *psize,void *p
               ,int timeout)

{
  int iVar1;
  bool bVar2;
  int iVar3;
  uint32 uVar4;
  uint8 uVar5;
  int iVar6;
  uint uVar7;
  int iVar8;
  size_t sVar9;
  ulong uVar10;
  uint uVar11;
  undefined6 in_register_00000032;
  uint uVar12;
  ec_mbxbuft MbxOut;
  ec_mbxbuft MbxIn;
  uint32 local_86c;
  short local_850;
  void *local_848;
  uint local_838;
  uint8 local_834;
  byte local_833;
  uint8 local_832;
  uint32 local_830;
  undefined1 local_82c [1012];
  int local_438;
  byte local_433;
  uint8 local_432;
  uint32 local_430;
  undefined1 local_42c [1020];
  
  iVar1 = *psize;
  ec_clearmbx((ec_mbxbuft *)&local_438);
  iVar3 = 0;
  ecx_mbxreceive(context,slave,(ec_mbxbuft *)&local_438,0);
  ec_clearmbx((ec_mbxbuft *)&local_838);
  sVar9 = strlen(filename);
  uVar10 = CONCAT62(in_register_00000032,slave) & 0xffffffff;
  uVar11 = context->slavelist[uVar10].mbx_l - 0xc;
  uVar7 = (uint)sVar9;
  if ((uVar11 & 0xffff) < ((uint)sVar9 & 0xffff)) {
    uVar7 = uVar11;
  }
  local_838 = (uint)(ushort)((short)uVar7 + 6);
  local_834 = '\0';
  uVar5 = ec_nextmbxcnt(context->slavelist[uVar10].mbx_cnt);
  context->slavelist[uVar10].mbx_cnt = uVar5;
  local_833 = uVar5 << 4 | 4;
  local_832 = '\x01';
  local_830 = password;
  memcpy(local_82c,filename,(ulong)(uVar7 & 0xffff));
  iVar6 = ecx_mbxsend(context,slave,(ec_mbxbuft *)&local_838,20000);
  if (0 < iVar6) {
    local_86c = 0;
    local_848 = p;
    do {
      ec_clearmbx((ec_mbxbuft *)&local_438);
      iVar6 = ecx_mbxreceive(context,slave,(ec_mbxbuft *)&local_438,timeout);
      uVar4 = local_430;
      if (iVar6 < 1) {
        bVar2 = true;
      }
      else {
        iVar6 = -3;
        iVar8 = iVar3;
        if ((local_433 & 0xf) == 4) {
          if (local_432 == '\x05') {
            bVar2 = false;
            iVar6 = -5;
          }
          else {
            if (local_432 != '\x03') goto LAB_00109def;
            local_86c = local_86c + 1;
            iVar6 = -6;
            if (local_430 == local_86c) {
              uVar7 = local_438 - 6;
              uVar12 = uVar7 & 0xffff;
              iVar8 = iVar3 + uVar12;
              if (iVar8 <= iVar1) {
                memcpy(local_848,local_42c,(ulong)uVar12);
                local_848 = (void *)((long)local_848 + (ulong)uVar12);
                local_850 = (short)uVar11;
                local_838 = 6;
                local_834 = '\0';
                uVar5 = ec_nextmbxcnt(context->slavelist[uVar10].mbx_cnt);
                context->slavelist[uVar10].mbx_cnt = uVar5;
                local_833 = uVar5 << 4 | 4;
                local_832 = '\x04';
                local_830 = uVar4;
                iVar6 = ecx_mbxsend(context,slave,(ec_mbxbuft *)&local_838,20000);
                bVar2 = 0 < iVar6 && (short)uVar7 == local_850;
                if (context->FOEhook != (_func_int_uint16_int_int *)0x0) {
                  (*context->FOEhook)(slave,uVar4,iVar8);
                }
                goto LAB_00109df2;
              }
            }
            bVar2 = false;
            iVar8 = iVar3;
          }
        }
        else {
LAB_00109def:
          bVar2 = false;
        }
LAB_00109df2:
        *psize = iVar8;
        bVar2 = (bool)(bVar2 ^ 1);
        iVar3 = iVar8;
      }
    } while (!bVar2);
  }
  return iVar6;
}

Assistant:

int ecx_FOEread(ecx_contextt *context, uint16 slave, char *filename, uint32 password, int *psize, void *p, int timeout)
{
   ec_FOEt *FOEp, *aFOEp;
   int wkc;
   int32 dataread = 0;
   int32 buffersize, packetnumber, prevpacket = 0;
   uint16 fnsize, maxdata, segmentdata;
   ec_mbxbuft MbxIn, MbxOut;
   uint8 cnt;
   boolean worktodo;

   buffersize = *psize;
   ec_clearmbx(&MbxIn);
   /* Empty slave out mailbox if something is in. Timout set to 0 */
   wkc = ecx_mbxreceive(context, slave, (ec_mbxbuft *)&MbxIn, 0);
   ec_clearmbx(&MbxOut);
   aFOEp = (ec_FOEt *)&MbxIn;
   FOEp = (ec_FOEt *)&MbxOut;
   fnsize = strlen(filename);
   maxdata = context->slavelist[slave].mbx_l - 12;
   if (fnsize > maxdata)
   {
      fnsize = maxdata;
   }
   FOEp->MbxHeader.length = htoes(0x0006 + fnsize);
   FOEp->MbxHeader.address = htoes(0x0000);
   FOEp->MbxHeader.priority = 0x00;
   /* get new mailbox count value, used as session handle */
   cnt = ec_nextmbxcnt(context->slavelist[slave].mbx_cnt);
   context->slavelist[slave].mbx_cnt = cnt;
   FOEp->MbxHeader.mbxtype = ECT_MBXT_FOE + (cnt << 4); /* FoE */
   FOEp->OpCode = ECT_FOE_READ;
   FOEp->Password = htoel(password);
   /* copy filename in mailbox */
   memcpy(&FOEp->FileName[0], filename, fnsize);
   /* send FoE request to slave */
   wkc = ecx_mbxsend(context, slave, (ec_mbxbuft *)&MbxOut, EC_TIMEOUTTXM);
   if (wkc > 0) /* succeeded to place mailbox in slave ? */
   {
      do
      {   
         worktodo = FALSE;
         /* clean mailboxbuffer */
         ec_clearmbx(&MbxIn);
         /* read slave response */
         wkc = ecx_mbxreceive(context, slave, (ec_mbxbuft *)&MbxIn, timeout);
         if (wkc > 0) /* succeeded to read slave response ? */
         {
            /* slave response should be FoE */
            if ((aFOEp->MbxHeader.mbxtype & 0x0f) == ECT_MBXT_FOE)
            {
               if(aFOEp->OpCode == ECT_FOE_DATA)
               {
                  segmentdata = etohs(aFOEp->MbxHeader.length) - 0x0006;
                  packetnumber = etohl(aFOEp->PacketNumber);
                  if ((packetnumber == ++prevpacket) && (dataread + segmentdata <= buffersize))
                  {
                     memcpy(p, &aFOEp->Data[0], segmentdata);
                     dataread += segmentdata;
                     p = (uint8 *)p + segmentdata;
                     if (segmentdata == maxdata)
                     {
                        worktodo = TRUE; 
                     }
                     FOEp->MbxHeader.length = htoes(0x0006);
                     FOEp->MbxHeader.address = htoes(0x0000);
                     FOEp->MbxHeader.priority = 0x00;
                     /* get new mailbox count value */
                     cnt = ec_nextmbxcnt(context->slavelist[slave].mbx_cnt);
                     context->slavelist[slave].mbx_cnt = cnt;
                     FOEp->MbxHeader.mbxtype = ECT_MBXT_FOE + (cnt << 4); /* FoE */
                     FOEp->OpCode = ECT_FOE_ACK;
                     FOEp->PacketNumber = htoel(packetnumber);
                     /* send FoE ack to slave */
                     wkc = ecx_mbxsend(context, slave, (ec_mbxbuft *)&MbxOut, EC_TIMEOUTTXM);
                     if (wkc <= 0)
                     {   
                        worktodo = FALSE;
                     }
                     if (context->FOEhook)
                     {
                        context->FOEhook(slave, packetnumber, dataread);
                     }
                  }
                  else
                  {
                     /* FoE error */
                     wkc = -EC_ERR_TYPE_FOE_BUF2SMALL;
                  }
               }
               else
               {
                  if(aFOEp->OpCode == ECT_FOE_ERROR)
                  {
                     /* FoE error */
                     wkc = -EC_ERR_TYPE_FOE_ERROR;
                  }
                  else
                  {
                     /* unexpected mailbox received */
                     wkc = -EC_ERR_TYPE_PACKET_ERROR;
                  }
               }
            }
            else
            {
               /* unexpected mailbox received */
               wkc = -EC_ERR_TYPE_PACKET_ERROR;
            }
            *psize = dataread;
         }
      } while (worktodo);   
   }
   
   return wkc;
}